

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O1

bool tcu::anon_unknown_3::verifyMultisampleLineGroupRasterization
               (Surface *surface,LineSceneSpec *scene,RasterizationArguments *args,TestLog *log,
               ClipMode clipMode)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  int side;
  uint uVar5;
  int iVar6;
  pointer pSVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  float sqSum;
  float fVar14;
  float fVar15;
  float fVar16;
  Vector<float,_2> res_3;
  Vec2 lineNormalDir;
  Vector<float,_2> res_10;
  Vec2 viewportSize;
  Vec2 lineDir;
  Vec2 lineNormalizedDeviceSpace [2];
  Vec2 lineQuadNormalizedDeviceSpace [4];
  Vec2 lineScreenSpace [2];
  Vector<float,_2> res_11;
  Vec2 lineQuadScreenSpace [4];
  TriangleSceneSpec triangleScene;
  Vector<float,_2> res_19;
  Vector<float,_2> res_20;
  Vector<float,_2> res_17;
  Vector<float,_2> res_18;
  Vector<float,_2> res_15;
  Vector<float,_2> res_16;
  float local_158 [2];
  ulong local_150;
  undefined1 *local_148;
  float local_13c;
  float local_138 [2];
  undefined8 local_130;
  float local_128 [6];
  undefined8 local_110;
  float local_108 [2];
  undefined8 local_100;
  float local_f8 [6];
  undefined1 *local_e0;
  float local_d8 [8];
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  local_b8;
  ClipMode local_94;
  float local_90 [12];
  RasterizationArguments *local_60;
  Surface *local_58;
  TestLog *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  local_138[0] = (float)surface->m_width;
  local_138[1] = (float)surface->m_height;
  local_13c = scene->lineWidth;
  local_b8.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_94 = clipMode;
  local_60 = args;
  local_58 = surface;
  local_50 = log;
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::resize(&local_b8,
           (long)(scene->lines).
                 super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(scene->lines).
                 super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5);
  pSVar7 = (scene->lines).
           super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(scene->lines).
                              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar7) >> 6)) {
    fVar16 = local_13c * 0.5;
    lVar11 = 0;
    local_13c = fVar16;
    do {
      fVar15 = *(float *)((long)pSVar7[lVar11].positions[0].m_data + 0xc);
      local_128[0] = pSVar7[lVar11].positions[0].m_data[0] / fVar15;
      local_128[1] = *(float *)((long)pSVar7[lVar11].positions[0].m_data + 4) / fVar15;
      fVar15 = *(float *)((long)(pSVar7[lVar11].positions + 1) + 0xc);
      local_128[2] = pSVar7[lVar11].positions[1].m_data[0] / fVar15;
      local_128[3] = *(float *)((long)(pSVar7[lVar11].positions + 1) + 4) / fVar15;
      if (local_94 == CLIPMODE_USE_CLIPPING_BOX) {
        uVar8 = 0;
        do {
          uVar5 = (uint)uVar8;
          fVar14 = (float)(int)(1 - (uVar5 & 0xfffffffe));
          uVar10 = uVar5 & 1;
          fVar15 = local_128[uVar10];
          fVar1 = local_128[(ulong)uVar10 + 2];
          fVar15 = (float)(~-(uint)(fVar15 == fVar1) & (uint)((fVar14 - fVar15) / (fVar1 - fVar15))
                          | -(uint)(fVar15 == fVar1) & 0xbf800000);
          if ((0.0 < fVar15) && (fVar15 < 1.0)) {
            uVar12 = (ulong)((uVar10 ^ 1) << 2);
            fVar2 = *(float *)((long)local_128 + uVar12);
            fVar3 = *(float *)((long)local_128 + uVar12 + 8);
            uVar13 = (ulong)(1 - (int)(uVar8 >> 1));
            if (fVar1 <= fVar14) {
              uVar13 = uVar8 >> 1;
            }
            local_128[uVar13 * 2 + (ulong)uVar10] = fVar14;
            *(float *)((long)local_128 + uVar12 + uVar13 * 8) =
                 fVar3 * fVar15 + (1.0 - fVar15) * fVar2;
          }
          uVar8 = (ulong)(uVar5 + 1);
        } while (uVar5 + 1 != 4);
      }
      local_130 = &DAT_3f8000003f800000;
      local_128[4] = 0.0;
      local_128[5] = 0.0;
      lVar9 = 0;
      do {
        local_128[lVar9 + 4] = local_128[lVar9] + *(float *)((long)&local_130 + lVar9 * 4);
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_d8[0] = 0.0;
      local_d8[1] = 0.0;
      lVar9 = 0;
      do {
        local_d8[lVar9] = local_128[lVar9 + 4] * 0.5;
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_f8[0] = 0.0;
      local_f8[1] = 0.0;
      lVar9 = 0;
      do {
        local_f8[lVar9] = local_d8[lVar9] * local_138[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_148 = &DAT_3f8000003f800000;
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      lVar9 = 0;
      do {
        local_158[lVar9] = local_128[lVar9 + 2] + *(float *)((long)&local_148 + lVar9 * 4);
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_150 = 0;
      lVar9 = 0;
      do {
        *(float *)((long)&local_150 + lVar9 * 4) = local_158[lVar9] * 0.5;
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_f8[2] = 0.0;
      local_f8[3] = 0.0;
      lVar9 = 0;
      do {
        local_f8[lVar9 + 2] = *(float *)((long)&local_150 + lVar9 * 4) * local_138[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_d8[0] = 0.0;
      local_d8[1] = 0.0;
      lVar9 = 0;
      do {
        local_d8[lVar9] = local_f8[lVar9 + 2] - local_f8[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      fVar15 = 0.0;
      lVar9 = 0;
      do {
        fVar15 = fVar15 + local_d8[lVar9] * local_d8[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      if (fVar15 < 0.0) {
        fVar15 = sqrtf(fVar15);
        fVar16 = local_13c;
      }
      else {
        fVar15 = SQRT(fVar15);
      }
      local_130 = (undefined1 *)0x0;
      lVar9 = 0;
      do {
        *(float *)((long)&local_130 + lVar9 * 4) = local_d8[lVar9] * (1.0 / fVar15);
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_150 = CONCAT44((undefined4)local_130,local_130._4_4_) ^ 0x8000000000000000;
      local_128[4] = 0.0;
      local_128[5] = 0.0;
      lVar9 = 0;
      do {
        local_128[lVar9 + 4] = *(float *)((long)&local_150 + lVar9 * 4) * fVar16;
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_d8[0] = 0.0;
      local_d8[1] = 0.0;
      lVar9 = 0;
      do {
        local_d8[lVar9] = local_f8[lVar9] + local_128[lVar9 + 4];
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      lVar9 = 0;
      do {
        local_158[lVar9] = *(float *)((long)&local_150 + lVar9 * 4) * fVar16;
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_d8[2] = 0.0;
      local_d8[3] = 0.0;
      lVar9 = 0;
      do {
        local_d8[lVar9 + 2] = local_f8[lVar9] - local_158[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_148 = (undefined1 *)0x0;
      lVar9 = 0;
      do {
        *(float *)((long)&local_148 + lVar9 * 4) = *(float *)((long)&local_150 + lVar9 * 4) * fVar16
        ;
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_d8[4] = 0.0;
      local_d8[5] = 0.0;
      lVar9 = 4;
      do {
        local_d8[lVar9] = *(float *)((long)&local_100 + lVar9 * 4) - local_158[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 == 5);
      local_e0 = (undefined1 *)0x0;
      lVar9 = 0;
      do {
        *(float *)((long)&local_e0 + lVar9 * 4) = *(float *)((long)&local_150 + lVar9 * 4) * fVar16;
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_d8[6] = 0.0;
      local_d8[7] = 0.0;
      lVar9 = 0;
      do {
        local_d8[lVar9 + 6] = local_f8[lVar9 + 2] + *(float *)((long)&local_e0 + lVar9 * 4);
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_148 = (undefined1 *)0x0;
      lVar9 = 0;
      do {
        *(float *)((long)&local_148 + lVar9 * 4) = local_d8[lVar9] / local_138[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_158[0] = 0.0;
      local_158[1] = 0.0;
      lVar9 = 0;
      do {
        fVar15 = *(float *)((long)&local_148 + lVar9 * 4);
        local_158[lVar9] = fVar15 + fVar15;
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_e0 = &DAT_3f8000003f800000;
      local_128[4] = 0.0;
      local_128[5] = 0.0;
      lVar9 = 0;
      do {
        local_128[lVar9 + 4] = local_158[lVar9] - *(float *)((long)&local_e0 + lVar9 * 4);
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_90[8] = 0.0;
      local_90[9] = 0.0;
      lVar9 = 0;
      do {
        local_90[lVar9 + 8] = local_d8[lVar9 + 2] / local_138[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_90[10] = 0.0;
      local_90[0xb] = 0.0;
      lVar9 = 0;
      do {
        local_90[lVar9 + 10] = local_90[lVar9 + 8] + local_90[lVar9 + 8];
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_38 = &DAT_3f8000003f800000;
      local_110 = 0;
      lVar9 = 0;
      do {
        *(float *)((long)&local_110 + lVar9 * 4) =
             local_90[lVar9 + 10] - *(float *)((long)&local_38 + lVar9 * 4);
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_90[4] = 0.0;
      local_90[5] = 0.0;
      lVar9 = 0;
      do {
        local_90[lVar9 + 4] = local_d8[lVar9 + 4] / local_138[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_90[6] = 0.0;
      local_90[7] = 0.0;
      lVar9 = 0;
      do {
        local_90[lVar9 + 6] = local_90[lVar9 + 4] + local_90[lVar9 + 4];
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_40 = &DAT_3f8000003f800000;
      local_108[0] = 0.0;
      local_108[1] = 0.0;
      lVar9 = 0;
      do {
        local_108[lVar9] = local_90[lVar9 + 6] - *(float *)((long)&local_40 + lVar9 * 4);
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_90[0] = 0.0;
      local_90[1] = 0.0;
      lVar9 = 0;
      do {
        local_90[lVar9] = local_d8[lVar9 + 6] / local_138[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_90[2] = 0.0;
      local_90[3] = 0.0;
      lVar9 = 0;
      do {
        local_90[lVar9 + 2] = local_90[lVar9] + local_90[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      local_48 = &DAT_3f8000003f800000;
      local_100 = 0;
      lVar9 = 0;
      do {
        *(float *)((long)&local_100 + lVar9 * 4) =
             local_90[lVar9 + 2] - *(float *)((long)&local_48 + lVar9 * 4);
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      lVar9 = (lVar11 << 0x21) >> 0x20;
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar9].positions[0].m_data[0] = local_128[4];
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar9].positions[0].m_data[1] = local_128[5];
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar9].positions[0].m_data[2] = 0.0;
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar9].positions[0].m_data[3] = 1.0;
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar9].sharedEdge[0] = false;
      *(undefined8 *)
       local_b8.
       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
       ._M_impl.super__Vector_impl_data._M_start[lVar9].positions[1].m_data = local_110;
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar9].positions[1].m_data[2] = 0.0;
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar9].positions[1].m_data[3] = 1.0;
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar9].sharedEdge[1] = false;
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar9].positions[2].m_data[0] = local_108[0];
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar9].positions[2].m_data[1] = local_108[1];
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar9].positions[2].m_data[2] = 0.0;
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar9].positions[2].m_data[3] = 1.0;
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar9].sharedEdge[2] = true;
      iVar6 = (int)lVar11 * 2 + 1;
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[0].m_data[0] = local_128[4];
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[0].m_data[1] = local_128[5];
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[0].m_data[2] = 0.0;
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[0].m_data[3] = 1.0;
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].sharedEdge[0] = true;
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[1].m_data[0] = local_108[0];
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[1].m_data[1] = local_108[1];
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[1].m_data[2] = 0.0;
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[1].m_data[3] = 1.0;
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].sharedEdge[1] = false;
      *(undefined8 *)
       local_b8.
       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
       ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[2].m_data = local_100;
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[2].m_data[2] = 0.0;
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].positions[2].m_data[3] = 1.0;
      local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar6].sharedEdge[2] = false;
      lVar11 = lVar11 + 1;
      pSVar7 = (scene->lines).
               super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar11 < (int)((ulong)((long)(scene->lines).
                                          super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar7)
                           >> 6));
  }
  bVar4 = verifyTriangleGroupRasterization
                    (local_58,(TriangleSceneSpec *)&local_b8,local_60,local_50,
                     VERIFICATIONMODE_STRICT);
  if (local_b8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool verifyMultisampleLineGroupRasterization (const tcu::Surface& surface, const LineSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log, ClipMode clipMode)
{
	// Multisampled line == 2 triangles

	const tcu::Vec2		viewportSize	= tcu::Vec2((float)surface.getWidth(), (float)surface.getHeight());
	const float			halfLineWidth	= scene.lineWidth * 0.5f;
	TriangleSceneSpec	triangleScene;

	triangleScene.triangles.resize(2 * scene.lines.size());
	for (int lineNdx = 0; lineNdx < (int)scene.lines.size(); ++lineNdx)
	{
		// Transform to screen space, add pixel offsets, convert back to normalized device space, and test as triangles
		tcu::Vec2 lineNormalizedDeviceSpace[2] =
		{
			tcu::Vec2(scene.lines[lineNdx].positions[0].x() / scene.lines[lineNdx].positions[0].w(), scene.lines[lineNdx].positions[0].y() / scene.lines[lineNdx].positions[0].w()),
			tcu::Vec2(scene.lines[lineNdx].positions[1].x() / scene.lines[lineNdx].positions[1].w(), scene.lines[lineNdx].positions[1].y() / scene.lines[lineNdx].positions[1].w()),
		};

		if (clipMode == CLIPMODE_USE_CLIPPING_BOX)
		{
			applyClippingBox(lineNormalizedDeviceSpace, 1.0f);
		}

		const tcu::Vec2 lineScreenSpace[2] =
		{
			(lineNormalizedDeviceSpace[0] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * viewportSize,
			(lineNormalizedDeviceSpace[1] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * viewportSize,
		};

		const tcu::Vec2 lineDir			= tcu::normalize(lineScreenSpace[1] - lineScreenSpace[0]);
		const tcu::Vec2 lineNormalDir	= tcu::Vec2(lineDir.y(), -lineDir.x());

		const tcu::Vec2 lineQuadScreenSpace[4] =
		{
			lineScreenSpace[0] + lineNormalDir * halfLineWidth,
			lineScreenSpace[0] - lineNormalDir * halfLineWidth,
			lineScreenSpace[1] - lineNormalDir * halfLineWidth,
			lineScreenSpace[1] + lineNormalDir * halfLineWidth,
		};
		const tcu::Vec2 lineQuadNormalizedDeviceSpace[4] =
		{
			lineQuadScreenSpace[0] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			lineQuadScreenSpace[1] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			lineQuadScreenSpace[2] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			lineQuadScreenSpace[3] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
		};

		triangleScene.triangles[lineNdx*2 + 0].positions[0] = tcu::Vec4(lineQuadNormalizedDeviceSpace[0].x(), lineQuadNormalizedDeviceSpace[0].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 0].sharedEdge[0] = false;
		triangleScene.triangles[lineNdx*2 + 0].positions[1] = tcu::Vec4(lineQuadNormalizedDeviceSpace[1].x(), lineQuadNormalizedDeviceSpace[1].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 0].sharedEdge[1] = false;
		triangleScene.triangles[lineNdx*2 + 0].positions[2] = tcu::Vec4(lineQuadNormalizedDeviceSpace[2].x(), lineQuadNormalizedDeviceSpace[2].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 0].sharedEdge[2] = true;

		triangleScene.triangles[lineNdx*2 + 1].positions[0] = tcu::Vec4(lineQuadNormalizedDeviceSpace[0].x(), lineQuadNormalizedDeviceSpace[0].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 1].sharedEdge[0] = true;
		triangleScene.triangles[lineNdx*2 + 1].positions[1] = tcu::Vec4(lineQuadNormalizedDeviceSpace[2].x(), lineQuadNormalizedDeviceSpace[2].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 1].sharedEdge[1] = false;
		triangleScene.triangles[lineNdx*2 + 1].positions[2] = tcu::Vec4(lineQuadNormalizedDeviceSpace[3].x(), lineQuadNormalizedDeviceSpace[3].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 1].sharedEdge[2] = false;
	}

	return verifyTriangleGroupRasterization(surface, triangleScene, args, log);
}